

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pbVar1;
  DescriptorPool *this_01;
  __type _Var2;
  FileDescriptor *pFVar3;
  char *pcVar4;
  Type *pTVar5;
  undefined8 *puVar6;
  int i;
  int index;
  Tables *pTVar7;
  long lVar8;
  DescriptorPool *this_02;
  ulong uVar9;
  FileDescriptorProto existing_proto;
  StringPiece local_178;
  StringPiece local_168;
  string local_158;
  StringPiece local_138;
  string local_128;
  FileDescriptorProto local_108;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pTVar7 = this->tables_;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_138,&this->filename_);
  pFVar3 = DescriptorPool::Tables::FindFile(pTVar7,local_138);
  if (pFVar3 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto(&local_108);
    FileDescriptor::CopyTo(pFVar3,&local_108);
    if ((pFVar3[0x3a] == (FileDescriptor)0x2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      pcVar4 = FileDescriptor::SyntaxName(SYNTAX_PROTO2);
      local_108._has_bits_.has_bits_[0]._0_1_ = (byte)local_108._has_bits_.has_bits_[0] | 4;
      puVar6 = (undefined8 *)
               (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ &
               0xfffffffffffffffc);
      if ((local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        puVar6 = (undefined8 *)*puVar6;
      }
      internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                (&local_108.syntax_,pcVar4,puVar6);
    }
    MessageLite::SerializeAsString_abi_cxx11_(&local_158,(MessageLite *)&local_108);
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)proto);
    _Var2 = std::operator==(&local_158,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_158);
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    if (_Var2) {
      return pFVar3;
    }
  }
  lVar8 = 0;
  uVar9 = 0;
  while( true ) {
    pTVar7 = this->tables_;
    pbVar1 = (pTVar7->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar7->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
    break;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if (_Var2) {
      AddRecursiveImportError(this,proto,(int)uVar9);
      goto LAB_0035f691;
    }
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0x20;
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pTVar7->pending_files_,
                (value_type *)((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    this_00 = &proto->dependency_;
    for (index = 0; pTVar7 = this->tables_,
        index < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_; index = index + 1) {
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_178,pTVar5);
      pFVar3 = DescriptorPool::Tables::FindFile(pTVar7,local_178);
      if (pFVar3 == (FileDescriptor *)0x0) {
        this_02 = this->pool_;
        this_01 = this_02->underlay_;
        if (this_01 != (DescriptorPool *)0x0) {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,index);
          pFVar3 = DescriptorPool::FindFileByName(this_01,pTVar5);
          if (pFVar3 != (FileDescriptor *)0x0) goto LAB_0035f638;
          this_02 = this->pool_;
        }
        pTVar5 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,index);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_168,pTVar5);
        DescriptorPool::TryFindFileInFallbackDatabase(this_02,local_168);
      }
LAB_0035f638:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&pTVar7->pending_files_);
    pTVar7 = this->tables_;
  }
  DescriptorPool::Tables::AddCheckpoint(pTVar7);
  pFVar3 = BuildFileImpl(this,proto);
  FileDescriptorTables::FinalizeTables(this->file_tables_);
  if (pFVar3 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_0035f691:
    pFVar3 = (FileDescriptor *)0x0;
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar3[0x39] = (FileDescriptor)0x1;
  }
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}